

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belief.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,Belief *belief)

{
  string local_30 [32];
  
  (*belief->_vptr_Belief[4])(local_30);
  std::operator<<(os,local_30);
  std::__cxx11::string::~string(local_30);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Belief& belief) {
	os << (&belief)->text();
	return os;
}